

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

StringBuilder * __thiscall Potassco::StringBuilder::append_(StringBuilder *this,uint64_t n,bool pos)

{
  bool bVar1;
  ulong uVar2;
  undefined7 in_register_00000011;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char temp [22];
  byte abStack_28 [32];
  
  uVar3 = -n;
  if ((int)CONCAT71(in_register_00000011,pos) != 0) {
    uVar3 = n;
  }
  uVar4 = 0x15;
  uVar2 = uVar4;
  uVar5 = uVar3;
  if (9 < uVar3) {
    do {
      uVar3 = uVar5 / 10;
      uVar2 = (ulong)((int)uVar4 - 1);
      abStack_28[uVar4] = (char)uVar5 + (char)uVar3 * -10 | 0x30;
      bVar1 = 99 < uVar5;
      uVar4 = uVar2;
      uVar5 = uVar3;
    } while (bVar1);
  }
  abStack_28[uVar2] = (byte)uVar3 | 0x30;
  if (!pos) {
    uVar2 = (ulong)((int)uVar2 - 1);
    abStack_28[uVar2] = 0x2d;
  }
  append(this,(char *)(abStack_28 + uVar2),0x16 - uVar2);
  return this;
}

Assistant:

StringBuilder& StringBuilder::append_(uint64_t n, bool pos) {
	char temp[22];
	if (!pos) { n = ~n + 1; }
	uint32_t p = static_cast<uint32_t>(sizeof(temp) - 1);
	while (n >= 10) {
		uint64_t const q = n / 10;
		uint32_t const r = static_cast<uint32_t>(n % 10);
		temp[p--] = static_cast<char>('0' + r);
		n = q;
	}
	temp[p] = static_cast<char>(static_cast<uint32_t>(n) + '0');
	if (!pos) { temp[--p] = '-'; }
	return append(temp + p, sizeof(temp) - p);
}